

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_2e6623f::DescriptorImpl::ToNormalizedString
          (DescriptorImpl *this,SigningProvider *arg,string *out,DescriptorCache *cache)

{
  int iVar1;
  long in_FS_OFFSET;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (*(this->super_Descriptor)._vptr_Descriptor[0x13])();
  AddChecksum(&local_40,out);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (out,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return SUB41(iVar1,0);
  }
  __stack_chk_fail();
}

Assistant:

bool ToNormalizedString(const SigningProvider& arg, std::string& out, const DescriptorCache* cache) const override final
    {
        bool ret = ToStringHelper(&arg, out, StringType::NORMALIZED, cache);
        out = AddChecksum(out);
        return ret;
    }